

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O2

void __thiscall
qclab::qgates::Phase<std::complex<float>_>::update
          (Phase<std::complex<float>_> *this,real_type theta)

{
  int iVar1;
  float fVar2;
  
  iVar1 = (*(this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[1])();
  if ((char)iVar1 == '\0') {
    fVar2 = cosf(theta);
    (this->angle_).cos_ = fVar2;
    fVar2 = sinf(theta);
    (this->angle_).sin_ = fVar2;
    return;
  }
  __assert_fail("!fixed()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/Phase.hpp"
                ,0xb8,
                "void qclab::qgates::Phase<std::complex<float>>::update(const real_type) [T = std::complex<float>]"
               );
}

Assistant:

void update( const real_type theta ) {
          assert( !fixed() ) ;
          angle_.update( theta ) ;
        }